

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::getChild
          (StreamingConcatenationExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff68;
  Info *in_stack_ffffffffffffff70;
  nullptr_t in_stack_ffffffffffffff78;
  
  switch(in_RDX) {
  case 0:
    token.info = in_stack_ffffffffffffff70;
    token._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x20825b,token);
    break;
  case 1:
    token_00.info = in_stack_ffffffffffffff70;
    token_00._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x20828b,token_00);
    break;
  case 2:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    break;
  case 3:
    token_01.info = in_stack_ffffffffffffff70;
    token_01._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x2082d3,token_01);
    break;
  case 4:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x50),in_stack_ffffffffffffff68);
    break;
  case 5:
    token_02.info = in_stack_ffffffffffffff70;
    token_02._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x208343,token_02);
    break;
  case 6:
    token_03.info = in_stack_ffffffffffffff70;
    token_03._0_8_ = in_stack_ffffffffffffff68;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x208376,token_03);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffff78);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax StreamingConcatenationExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBrace;
        case 1: return operatorToken;
        case 2: return sliceSize;
        case 3: return innerOpenBrace;
        case 4: return &expressions;
        case 5: return innerCloseBrace;
        case 6: return closeBrace;
        default: return nullptr;
    }
}